

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.hpp
# Opt level: O1

optional<double> assign_0oo(string_view value)

{
  undefined8 in_RAX;
  ulong __n;
  bool bVar1;
  _Storage<double,_true> in_XMM0_Qa;
  optional<double> oVar2;
  double result;
  char buffer [513];
  _Storage<double,_true> local_220;
  undefined1 local_218 [520];
  
  __n = value._M_len;
  if (__n < 0x201) {
    memset(local_218,0,0x201);
    if (__n != 0) {
      memcpy(local_218,value._M_str,__n);
    }
    local_220._M_value = 0.0;
    in_RAX = __isoc99_sscanf(local_218,"%lf",&local_220);
    bVar1 = (int)in_RAX != 0;
    in_XMM0_Qa = local_220;
  }
  else {
    bVar1 = false;
  }
  oVar2.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _9_7_ = (undefined7)((ulong)in_RAX >> 8);
  oVar2.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_engaged = 0.0 < in_XMM0_Qa._M_value & bVar1;
  oVar2.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_payload._M_value = in_XMM0_Qa._M_value;
  return (optional<double>)
         oVar2.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double>;
}

Assistant:

constexpr inline std::optional<double>
to_double(std::string_view s) noexcept
{
    // if (auto [p, ec] =
    //       std::from_chars(s.data(), s.data() + s.size(), value, 10);
    //     ec != std::errc())
    //     return bad_value;
    // return value;

    constexpr std::size_t size_limit = 512;

    if (s.size() > size_limit)
        return std::nullopt;

    char buffer[size_limit + 1] = { '\0' };
    std::size_t i = 0;
    std::size_t e = std::min(s.size(), size_limit);

    for (i = 0; i != e; ++i)
        buffer[i] = s[i];

    double result = 0;
    if (auto read = std::sscanf(buffer, "%lf", &result); read)
        return result;
    else
        return std::nullopt;
}